

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

uint64_t __thiscall fast_float::bigint::hi64(bigint *this,bool *truncated)

{
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  uVar1 = (this->vec).length;
  uVar7 = (ulong)uVar1;
  if (uVar1 == 1) {
    uVar7 = (this->vec).data[uVar7 - 1];
    *truncated = false;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    return uVar7 << (~(byte)lVar3 & 0x3f);
  }
  if (uVar1 == 0) {
    *truncated = false;
    return 0;
  }
  uVar2 = (this->vec).data[uVar7 - 2];
  uVar5 = (this->vec).data[uVar7 - 1];
  uVar4 = 0x3f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar8 = uVar2;
  if ((uVar4 ^ 0x3f) != 0) {
    bVar6 = (byte)(uVar4 ^ 0x3f);
    uVar8 = uVar2 << (bVar6 & 0x3f);
    bVar6 = bVar6 & 0x3f;
    uVar5 = uVar5 << bVar6 | uVar2 >> 0x40 - bVar6;
  }
  if (uVar1 < 3) {
    bVar10 = false;
  }
  else {
    bVar10 = true;
    if ((this->vec).data[uVar7 - 3] == 0) {
      lVar3 = 0;
      do {
        lVar9 = lVar3;
        if (3 - uVar7 == lVar9) break;
        lVar3 = lVar9 + -1;
      } while ((this->vec).data[uVar7 + lVar9 + -4] == 0);
      bVar10 = 3U - lVar9 < uVar7;
    }
  }
  *truncated = (bool)(bVar10 | uVar8 != 0);
  return uVar5;
}

Assistant:

constexpr size_t len() const noexcept {
    return length;
  }